

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

void vkt::api::anon_unknown_0::createFormatTests(TestCaseGroup *testGroup)

{
  undefined8 __s;
  char *__s_00;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_81;
  string local_80 [32];
  string local_60;
  undefined1 local_40 [8];
  string caseName;
  char *enumName;
  VkFormat format;
  deUint32 formatNdx;
  TestCaseGroup *testGroup_local;
  
  for (enumName._4_4_ = VK_FORMAT_R4G4_UNORM_PACK8;
      enumName._4_4_ < (VK_FORMAT_ASTC_12x12_SRGB_BLOCK|VK_FORMAT_R4G4_UNORM_PACK8);
      enumName._4_4_ = enumName._4_4_ + VK_FORMAT_R4G4_UNORM_PACK8) {
    __s_00 = ::vk::getFormatName(enumName._4_4_);
    caseName.field_2._8_8_ = __s_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,__s_00,&local_81);
    std::__cxx11::string::substr((ulong)&local_60,(ulong)local_80);
    de::toLower((string *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    __s = caseName.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,(char *)__s,&local_b9);
    addFunctionCase<vk::VkFormat>
              (testGroup,(string *)local_40,&local_b8,formatProperties,enumName._4_4_);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::__cxx11::string::~string((string *)local_40);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"depth_stencil",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_109);
  addFunctionCase(testGroup,&local_e0,&local_108,testDepthStencilSupported);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"compressed_formats",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
  addFunctionCase(testGroup,&local_130,&local_158,testCompressedFormatsSupported);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  return;
}

Assistant:

void createFormatTests (tcu::TestCaseGroup* testGroup)
{
	DE_STATIC_ASSERT(VK_FORMAT_UNDEFINED == 0);

	for (deUint32 formatNdx = VK_FORMAT_UNDEFINED+1; formatNdx < VK_CORE_FORMAT_LAST; ++formatNdx)
	{
		const VkFormat		format			= (VkFormat)formatNdx;
		const char* const	enumName		= getFormatName(format);
		const string		caseName		= de::toLower(string(enumName).substr(10));

		addFunctionCase(testGroup, caseName, enumName, formatProperties, format);
	}

	addFunctionCase(testGroup, "depth_stencil",			"",	testDepthStencilSupported);
	addFunctionCase(testGroup, "compressed_formats",	"",	testCompressedFormatsSupported);
}